

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAT2FO.cpp
# Opt level: O3

void __thiscall SAT::SAT2FO::collectAssignment(SAT2FO *this,SATSolver *solver,LiteralStack *res)

{
  uint uVar1;
  int iVar2;
  Literal *pLVar3;
  Literal **ppLVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  bool bVar8;
  
  uVar1 = (this->_posMap)._nextNum;
  uVar5 = 0;
  uVar6 = uVar1 - 1;
  bVar8 = uVar6 != 0;
  if (uVar1 == 0) {
    uVar6 = 0;
  }
  if (uVar1 != 0 && bVar8) {
    iVar7 = 2;
    do {
      uVar5 = uVar5 + 1;
      iVar2 = (*solver->_vptr_SATSolver[6])(solver,(ulong)uVar5);
      if (iVar2 != 2) {
        pLVar3 = toFO(this,(SATLiteral)(iVar7 + (uint)(iVar2 == 0)));
        if (pLVar3 != (Literal *)0x0) {
          ppLVar4 = res->_cursor;
          if (ppLVar4 == res->_end) {
            Lib::Stack<Kernel::Literal_*>::expand(res);
            ppLVar4 = res->_cursor;
          }
          *ppLVar4 = pLVar3;
          res->_cursor = res->_cursor + 1;
        }
      }
      iVar7 = iVar7 + 2;
    } while (uVar5 < uVar6);
  }
  return;
}

Assistant:

void SAT2FO::collectAssignment(SATSolver& solver, LiteralStack& res) const
{
  // ASS_EQ(solver.getStatus(), SATSolver::SATISFIABLE);
  ASS(res.isEmpty());

  unsigned maxVar = maxSATVar();
  for (unsigned i = 1; i <= maxVar; i++) {
    SATSolver::VarAssignment asgn = solver.getAssignment(i);
    if(asgn==SATSolver::VarAssignment::DONT_CARE) {
      //we don't add DONT_CARE literals into the assignment
      continue;
    }
    ASS(asgn==SATSolver::VarAssignment::TRUE || asgn==SATSolver::VarAssignment::FALSE);
    SATLiteral sl(i, asgn==SATSolver::VarAssignment::TRUE);
    ASS(solver.trueInAssignment(sl));
    Literal* lit = toFO(sl);
    if(!lit) {
      //SAT literal doesn't have corresponding FO one
      continue;
    }
    res.push(lit);
  }
}